

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::UpdateGroupDependencies(cmComputeLinkDepends *this)

{
  _Rb_tree_color _Var1;
  EntryKind EVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  _Rb_tree_node_base *p_Var6;
  cmGraphEdge *edge;
  pointer pcVar7;
  int index;
  int local_5c;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_58;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_40 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_40 != local_48) {
      do {
        pcVar7 = (local_40->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                 super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_38 = (local_40->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (pcVar7 != local_38) {
          do {
            local_5c = pcVar7->Dest;
            EVar2 = (this->EntryList).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_5c].Kind;
            if ((Group < EVar2) || ((0x1aU >> (EVar2 & 0x1f) & 1) == 0)) {
              for (p_Var6 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var6 !=
                  &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header;
                  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                _Var5 = std::
                        __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                  (p_Var6[1]._M_parent,p_Var6[1]._M_left,&local_5c);
                if ((_Base_ptr)_Var5._M_current != p_Var6[1]._M_left) {
                  _Var1 = p_Var6[1]._M_color;
                  local_58.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  local_58.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_58);
                  _Var4._M_pi = local_58.TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                  peVar3 = local_58.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  local_58.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  local_58.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  pcVar7->Dest = _Var1;
                  pcVar7->Strong = false;
                  pcVar7->Cross = false;
                  this_00 = (pcVar7->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (pcVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar3;
                  (pcVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = _Var4._M_pi;
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                  }
                  if (local_58.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_58.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
              }
            }
            pcVar7 = pcVar7 + 1;
          } while (pcVar7 != local_38);
        }
        local_40 = local_40 + 1;
      } while (local_40 != local_48);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::UpdateGroupDependencies()
{
  if (this->GroupItems.empty()) {
    return;
  }

  // Walks through all entries of the constraint graph to replace dependencies
  // over raw items by the group it belongs to, if any.
  for (auto& edgeList : this->EntryConstraintGraph) {
    for (auto& edge : edgeList) {
      int index = edge;
      if (this->EntryList[index].Kind == LinkEntry::Group ||
          this->EntryList[index].Kind == LinkEntry::Flag ||
          this->EntryList[index].Kind == LinkEntry::Object) {
        continue;
      }
      // search the item in the defined groups
      for (const auto& groupItems : this->GroupItems) {
        auto pos = std::find(groupItems.second.cbegin(),
                             groupItems.second.cend(), index);
        if (pos != groupItems.second.cend()) {
          // replace lib dependency by the group it belongs to
          edge = cmGraphEdge{ groupItems.first, false, false,
                              cmListFileBacktrace() };
        }
      }
    }
  }
}